

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Type a,Type b)

{
  bool bVar1;
  uint uVar2;
  HeapType this_00;
  HeapType a_00;
  uintptr_t extraout_RDX;
  Type b_00;
  uintptr_t extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  uintptr_t extraout_RDX_02;
  HeapType b_01;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  bool bVar6;
  Type local_38;
  Type b_local;
  Type a_local;
  
  if (this == (SubTyper *)0x1 || this == (SubTyper *)a.id) {
    return true;
  }
  local_38.id = a.id;
  b_local.id = (uintptr_t)this;
  if ((((ulong)this & 1) == 0 || this < (SubTyper *)0x7) || ((a.id & 1) == 0 || a.id < 7)) {
    if ((((ulong)this & 1) == 0 && (SubTyper *)0x6 < this) &&
       (((a.id & 1) == 0 && 6 < a.id && (((byte)this >> 1 & (a.id & 2) == 0) == 0)))) {
      this_00 = wasm::Type::getHeapType(&b_local);
      a_00 = wasm::Type::getHeapType(&local_38);
      bVar6 = wasm::Type::isExact(&local_38);
      b_01.id = extraout_RDX_01;
      if (bVar6) {
        bVar6 = wasm::Type::isExact(&b_local);
        if (bVar6) {
          return this_00.id == a_00.id;
        }
        if (0x7c < this_00.id) {
          return false;
        }
        uVar2 = (uint)this_00.id & 0x7b;
        b_01.id = extraout_RDX_02;
        if (4 < (uVar2 << 0x1d | uVar2 - 8 >> 3) - 10) {
          return false;
        }
      }
      bVar6 = isSubType((SubTyper *)this_00.id,a_00,b_01);
      return bVar6;
    }
  }
  else {
    plVar3 = (long *)((ulong)this & 0xfffffffffffffffe);
    plVar5 = (long *)(a.id & 0xfffffffffffffffe);
    if (plVar3[1] - *plVar3 == plVar5[1] - *plVar5) {
      bVar6 = (undefined8 *)plVar3[1] == (undefined8 *)*plVar3;
      if (bVar6) {
        return bVar6;
      }
      bVar1 = isSubType(*(SubTyper **)*plVar3,(Type)*(uintptr_t *)*plVar5,b);
      if (bVar1) {
        uVar4 = 1;
        b_00.id = extraout_RDX;
        do {
          bVar6 = (ulong)(plVar3[1] - *plVar3 >> 3) <= uVar4;
          if (bVar6) {
            return bVar6;
          }
          bVar1 = isSubType(*(SubTyper **)(*plVar3 + uVar4 * 8),
                            (Type)*(uintptr_t *)(*plVar5 + uVar4 * 8),b_00);
          uVar4 = uVar4 + 1;
          b_00.id = extraout_RDX_00;
        } while (bVar1);
        return bVar6;
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool SubTyper::isSubType(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a == Type::unreachable) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return isSubType(a.getTuple(), b.getTuple());
  }
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.isNullable() && !b.isNullable()) {
    return false;
  }
  auto heapTypeA = a.getHeapType();
  auto heapTypeB = b.getHeapType();
  if (b.isExact()) {
    if (a.isExact()) {
      return heapTypeA == heapTypeB;
    }
    if (!heapTypeA.isBottom()) {
      return false;
    }
  }
  return isSubType(heapTypeA, heapTypeB);
}